

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O0

Min_Cube_t *
Abc_NodeCovProduct(Cov_Man_t *p,Min_Cube_t *pCover0,Min_Cube_t *pCover1,int fEsop,int nSupp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Min_Cube_t *pMVar4;
  uint local_5c;
  uint local_58;
  int Val1;
  int Val0;
  int i;
  Min_Cube_t *pCover;
  Min_Cube_t *pCube1;
  Min_Cube_t *pCube0;
  Min_Cube_t *pCube;
  int nSupp_local;
  int fEsop_local;
  Min_Cube_t *pCover1_local;
  Min_Cube_t *pCover0_local;
  Cov_Man_t *p_local;
  
  if ((pCover0 == (Min_Cube_t *)0x0) || (pCover1 == (Min_Cube_t *)0x0)) {
    __assert_fail("pCover0 && pCover1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x1da,
                  "Min_Cube_t *Abc_NodeCovProduct(Cov_Man_t *, Min_Cube_t *, Min_Cube_t *, int, int)"
                 );
  }
  Min_ManClean(p->pManMin,nSupp);
  pCube1 = pCover0;
  do {
    pCover = pCover1;
    if (pCube1 == (Min_Cube_t *)0x0) {
      if (fEsop == 0) {
        Min_SopMinimize(p->pManMin);
      }
      else {
        Min_EsopMinimize(p->pManMin);
      }
      p_local = (Cov_Man_t *)Min_CoverCollect(p->pManMin,nSupp);
      iVar3 = Min_CoverCountCubes((Min_Cube_t *)p_local);
      if (p->nFaninMax < iVar3) {
        Min_CoverRecycle(p->pManMin,(Min_Cube_t *)p_local);
        p_local = (Cov_Man_t *)0x0;
      }
      return (Min_Cube_t *)p_local;
    }
    for (; pCover != (Min_Cube_t *)0x0; pCover = pCover->pNext) {
      for (Val1 = 0; Val1 < p->vPairs0->nSize; Val1 = Val1 + 1) {
        uVar1 = Min_CubeGetVar(pCube1,p->vPairs0->pArray[Val1]);
        uVar2 = Min_CubeGetVar(pCover,p->vPairs1->pArray[Val1]);
        if ((uVar1 & uVar2) == 0) break;
      }
      if (p->vPairs0->nSize <= Val1) {
        if (p->nCubesMax < p->pManMin->nCubes) {
          pMVar4 = Min_CoverCollect(p->pManMin,nSupp);
          Min_CoverRecycle(p->pManMin,pMVar4);
          return (Min_Cube_t *)0x0;
        }
        pMVar4 = Min_CubeAlloc(p->pManMin);
        *(uint *)&pMVar4->field_0x8 = *(uint *)&pMVar4->field_0x8 & 0x3fffff;
        for (Val1 = 0; Val1 < nSupp; Val1 = Val1 + 1) {
          if (p->vComTo0->pArray[Val1] == -1) {
            local_58 = 3;
          }
          else {
            local_58 = Min_CubeGetVar(pCube1,p->vComTo0->pArray[Val1]);
          }
          if (p->vComTo1->pArray[Val1] == -1) {
            local_5c = 3;
          }
          else {
            local_5c = Min_CubeGetVar(pCover,p->vComTo1->pArray[Val1]);
          }
          if ((local_58 & local_5c) != 3) {
            Min_CubeXorVar(pMVar4,Val1,local_58 & local_5c ^ 3);
            *(uint *)&pMVar4->field_0x8 =
                 *(uint *)&pMVar4->field_0x8 & 0x3fffff |
                 ((*(uint *)&pMVar4->field_0x8 >> 0x16) + 1) * 0x400000;
          }
        }
        if (fEsop == 0) {
          Min_SopAddCube(p->pManMin,pMVar4);
        }
        else {
          Min_EsopAddCube(p->pManMin,pMVar4);
        }
      }
    }
    pCube1 = pCube1->pNext;
  } while( true );
}

Assistant:

Min_Cube_t * Abc_NodeCovProduct( Cov_Man_t * p, Min_Cube_t * pCover0, Min_Cube_t * pCover1, int fEsop, int nSupp )
{
    Min_Cube_t * pCube, * pCube0, * pCube1;
    Min_Cube_t * pCover;
    int i, Val0, Val1;
    assert( pCover0 && pCover1 );

    // clean storage
    Min_ManClean( p->pManMin, nSupp );
    // go through the cube pairs
    Min_CoverForEachCube( pCover0, pCube0 )
    Min_CoverForEachCube( pCover1, pCube1 )
    {
        // go through the support variables of the cubes
        for ( i = 0; i < p->vPairs0->nSize; i++ )
        {
            Val0 = Min_CubeGetVar( pCube0, p->vPairs0->pArray[i] );
            Val1 = Min_CubeGetVar( pCube1, p->vPairs1->pArray[i] );
            if ( (Val0 & Val1) == 0 )
                break;
        }
        // check disjointness
        if ( i < p->vPairs0->nSize )
            continue;

        if ( p->pManMin->nCubes > p->nCubesMax )
        {
            pCover = Min_CoverCollect( p->pManMin, nSupp );
//Min_CoverWriteFile( pCover, "large", 1 );
            Min_CoverRecycle( p->pManMin, pCover );
            return NULL;
        }

        // create the product cube
        pCube = Min_CubeAlloc( p->pManMin );

        // add the literals
        pCube->nLits = 0;
        for ( i = 0; i < nSupp; i++ )
        {
            if ( p->vComTo0->pArray[i] == -1 )
                Val0 = 3;
            else
                Val0 = Min_CubeGetVar( pCube0, p->vComTo0->pArray[i] );

            if ( p->vComTo1->pArray[i] == -1 )
                Val1 = 3;
            else
                Val1 = Min_CubeGetVar( pCube1, p->vComTo1->pArray[i] );

            if ( (Val0 & Val1) == 3 )
                continue;

            Min_CubeXorVar( pCube, i, (Val0 & Val1) ^ 3 );
            pCube->nLits++;
        }
        // add the cube to storage
        if ( fEsop ) 
            Min_EsopAddCube( p->pManMin, pCube );
        else
            Min_SopAddCube( p->pManMin, pCube );
    }

    // minimize the cover
    if ( fEsop ) 
        Min_EsopMinimize( p->pManMin );
    else
        Min_SopMinimize( p->pManMin );
    pCover = Min_CoverCollect( p->pManMin, nSupp );

    // quit if the cover is too large
    if ( Min_CoverCountCubes(pCover) > p->nFaninMax )
    {
/*        
Min_CoverWriteFile( pCover, "large", 1 );
        Min_CoverExpand( p->pManMin, pCover );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        pCover = Min_CoverCollect( p->pManMin, nSupp );
*/
        Min_CoverRecycle( p->pManMin, pCover );
        return NULL;
    }
    return pCover;
}